

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::array<tinyusdz::value::half,4ul>>
          (GeomPrimvar *this,array<tinyusdz::value::half,_4UL> *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  undefined1 *puVar2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer pSVar6;
  array<tinyusdz::value::half,_4UL> *paVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 uVar9;
  pointer pSVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (array<tinyusdz::value::half,_4UL> *)0x0) {
joined_r0x001ae992:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar4 = false;
        uVar9 = 0;
      }
      else {
        uVar5 = (*pvVar1->type_id)();
        bVar4 = uVar5 == 4;
        uVar9 = (undefined7)((ulong)in_RCX >> 8);
      }
      bVar3 = (this->_attr)._var._blocked;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar9,bVar4 | bVar3);
      if (bVar4 != false || (bVar3 & 1) != 0) goto joined_r0x001ae992;
    }
    else {
      bVar3 = (this->_attr)._var._blocked;
    }
    if ((((bVar3 & 1) == 0) &&
        (pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar5 = (*pvVar1->type_id)(), uVar5 == 0 ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar5 = (*pvVar1->type_id)(), uVar5 == 1)))))) {
      pSVar10 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar6 != pSVar10) {
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
          pSVar10 = (this->_attr)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar6 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pSVar6 == pSVar10) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        paVar7 = tinyusdz::value::Value::as<std::array<tinyusdz::value::half,4ul>>
                           (&pSVar10->value,false);
        if (paVar7 == (array<tinyusdz::value::half,_4UL> *)0x0) {
          return false;
        }
        uVar8 = *(undefined8 *)paVar7->_M_elems;
LAB_001aeaab:
        *(undefined8 *)dest->_M_elems = uVar8;
        return true;
      }
    }
    else {
      this_00 = &this->_attr;
      uVar5 = Attribute::type_id(this_00);
      bVar4 = IsSupportedGeomPrimvarType(uVar5);
      if (bVar4) {
        primvar::PrimVar::get_value<std::array<tinyusdz::value::half,4ul>>
                  ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&local_78,
                   &(this->_attr)._var);
        if ((char)local_78._M_dataplus._M_p == '\x01') {
          uVar8 = CONCAT26((undefined2)local_78._M_string_length,local_78._M_dataplus._M_p._2_6_);
          goto LAB_001aeaab;
        }
        if (err == (string *)0x0) {
          return false;
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   "");
        local_54._0_4_ = 0x13;
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  (&local_78,(fmt *)local_98,(string *)local_54,(uint *)(local_54 + 4),in_R8);
        std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT62(local_78._M_dataplus._M_p._2_6_,
                            CONCAT11(local_78._M_dataplus._M_p._1_1_,(char)local_78._M_dataplus._M_p
                                    )));
        puVar2 = (undefined1 *)
                 CONCAT62(local_78._M_dataplus._M_p._2_6_,
                          CONCAT11(local_78._M_dataplus._M_p._1_1_,(char)local_78._M_dataplus._M_p))
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2 != &local_78.field_2) {
          operator_delete(puVar2,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_98[0] == local_88) {
          return false;
        }
      }
      else {
        if (err == (string *)0x0) {
          return false;
        }
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<std::__cxx11::string>(&local_78,(fmt *)local_98,(string *)(local_54 + 4),in_RCX)
        ;
        std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT62(local_78._M_dataplus._M_p._2_6_,
                            CONCAT11(local_78._M_dataplus._M_p._1_1_,(char)local_78._M_dataplus._M_p
                                    )));
        puVar2 = (undefined1 *)
                 CONCAT62(local_78._M_dataplus._M_p._2_6_,
                          CONCAT11(local_78._M_dataplus._M_p._1_1_,(char)local_78._M_dataplus._M_p))
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2 != &local_78.field_2) {
          operator_delete(puVar2,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_98[0] == local_88) {
          return false;
        }
      }
      operator_delete(local_98[0],local_88[0] + 1);
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}